

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O2

void __thiscall cnn::Model::reset_gradient(Model *this)

{
  pointer ppPVar1;
  pointer ppLVar2;
  pointer ppPVar3;
  pointer ppLVar4;
  
  ppPVar1 = (this->params).super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppPVar3 = (this->params).
                 super__Vector_base<cnn::Parameters_*,_std::allocator<cnn::Parameters_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppPVar3 != ppPVar1; ppPVar3 = ppPVar3 + 1) {
    TensorTools::Zero(&(*ppPVar3)->g);
  }
  ppLVar2 = (this->lookup_params).
            super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppLVar4 = (this->lookup_params).
                 super__Vector_base<cnn::LookupParameters_*,_std::allocator<cnn::LookupParameters_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppLVar4 != ppLVar2;
      ppLVar4 = ppLVar4 + 1) {
    LookupParameters::clear(*ppLVar4);
  }
  return;
}

Assistant:

void Model::reset_gradient() {
  for (auto p : params) { p->clear(); }
  for (auto p : lookup_params) { p->clear(); }
}